

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflow.cpp
# Opt level: O1

void __thiscall Arcflow::build(Arcflow *this)

{
  NodeSet *this_00;
  pointer pAVar1;
  runtime_error *this_01;
  char _error_msg_ [256];
  allocator_type local_159;
  vector<int,_std::allocator<int>_> local_158;
  vector<int,_std::allocator<int>_> local_140;
  vector<int,_std::allocator<int>_> local_128 [11];
  
  if (this->ready == false) {
    std::
    _Rb_tree<std::vector<int,_std::allocator<int>_>,_std::pair<const_std::vector<int,_std::allocator<int>_>,_int>,_std::_Select1st<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
    ::clear(&(this->dp)._M_t);
    pAVar1 = (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.super__Vector_impl_data
             ._M_start;
    if ((this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.super__Vector_impl_data.
        _M_finish != pAVar1) {
      (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.super__Vector_impl_data.
      _M_finish = pAVar1;
    }
    this_00 = &this->NS;
    NodeSet::clear(this_00);
    if ((this->inst).binary == true) {
      local_128[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = 0;
      std::vector<int,_std::allocator<int>_>::vector
                (&local_140,(long)this->label_size,(value_type_conflict *)local_128,&local_159);
      go(this);
    }
    else {
      local_128[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = 0;
      std::vector<int,_std::allocator<int>_>::vector
                (&local_158,(long)(this->label_size + 2),(value_type_conflict *)local_128,&local_159
                );
      go(this);
      local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
    }
    if (local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    printf("  #dp: %d\n",(ulong)(uint)(this->dp)._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    _Rb_tree<std::vector<int,_std::allocator<int>_>,_std::pair<const_std::vector<int,_std::allocator<int>_>,_int>,_std::_Select1st<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
    ::clear(&(this->dp)._M_t);
    std::vector<Arc,std::allocator<Arc>>::_M_assign_aux<std::_Rb_tree_const_iterator<Arc>>
              ((vector<Arc,std::allocator<Arc>> *)&this->A,
               (this->AS)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
               &(this->AS)._M_t._M_impl.super__Rb_tree_header);
    std::_Rb_tree<Arc,_Arc,_std::_Identity<Arc>,_std::less<Arc>,_std::allocator<Arc>_>::clear
              (&(this->AS)._M_t);
    NodeSet::topological_order(local_128,this_00);
    relabel_graph(this,local_128);
    if ((void *)CONCAT44(local_128[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,
                         local_128[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
      operator_delete((void *)CONCAT44(local_128[0].super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                                       local_128[0].super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start._0_4_));
    }
    NodeSet::sort(this_00);
    return;
  }
  snprintf((char *)local_128,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
           "ready == false",
           "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
           ,0x168);
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,(char *)local_128);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Arcflow::build() {
	throw_assert(ready == false);
	dp.clear();
	A.clear();
	NS.clear();

	if (inst.binary) {
		go(std::vector<int>(label_size, 0));
	} else {
		go(std::vector<int>(label_size + 2, 0));
	}

	printf("  #dp: %d\n", static_cast<int>(dp.size()));

	dp.clear();
	A.assign(all(AS));
	AS.clear();

	relabel_graph(NS.topological_order());
	NS.sort();
}